

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arch_specific.cc
# Opt level: O0

double highwayhash::InvariantTicksPerSecond(void)

{
  double dVar1;
  
  dVar1 = NominalClockRate();
  return dVar1;
}

Assistant:

double InvariantTicksPerSecond() {
#if HH_ARCH_PPC
#if __GLIBC__
  static const double cycles_per_second = __ppc_get_timebase_freq();
#elif __FreeBSD__
  double cycles_per_second = 0;
  size_t length = sizeof(cycles_per_second);
  sysctlbyname("kern.timecounter.tc.timebase.frequency", &cycles_per_second,
               &length, NULL, 0);
#elif __OpenBSD__
  /* There is currently no method of retrieving this via userland.
   * This value is correct for Power8 and Power9.
   */
  static const double cycles_per_second = 512000000;
#endif
  return cycles_per_second;
#else
  return NominalClockRate();
#endif
}